

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::SerializeWithCachedSizesToArray
          (CodeGeneratorRequest *this,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  char *pcVar4;
  string *psVar5;
  uint8 *puVar6;
  FileDescriptorProto *this_00;
  UnknownFieldSet *pUVar7;
  int local_e0;
  int local_dc;
  int i_1;
  int i;
  uint8 *target_local;
  CodeGeneratorRequest *this_local;
  byte *local_40;
  byte *local_28;
  byte *local_10;
  
  _i_1 = target;
  for (local_dc = 0; iVar2 = file_to_generate_size(this), local_dc < iVar2; local_dc = local_dc + 1)
  {
    file_to_generate_abi_cxx11_(this,local_dc);
    pcVar4 = (char *)std::__cxx11::string::data();
    file_to_generate_abi_cxx11_(this,local_dc);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = file_to_generate_abi_cxx11_(this,local_dc);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_28 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_28 = _i_1 + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_28);
    _i_1 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_parameter(this);
  if (bVar1) {
    parameter_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    parameter_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = parameter_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_40 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_40 = _i_1 + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_40);
    _i_1 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  for (local_e0 = 0; iVar2 = proto_file_size(this), local_e0 < iVar2; local_e0 = local_e0 + 1) {
    this_00 = proto_file(this,local_e0);
    uVar3 = internal::WireFormatLite::MakeTag(0xf,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_10 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_10 = _i_1 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = FileDescriptorProto::GetCachedSize(this_00);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    _i_1 = FileDescriptorProto::SerializeWithCachedSizesToArray(this_00,puVar6);
  }
  pUVar7 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar7);
  if (!bVar1) {
    pUVar7 = unknown_fields(this);
    _i_1 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar7,_i_1);
  }
  return _i_1;
}

Assistant:

::google::protobuf::uint8* CodeGeneratorRequest::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // repeated string file_to_generate = 1;
  for (int i = 0; i < this->file_to_generate_size(); i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->file_to_generate(i).data(), this->file_to_generate(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(1, this->file_to_generate(i), target);
  }

  // optional string parameter = 2;
  if (has_parameter()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->parameter().data(), this->parameter().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->parameter(), target);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (int i = 0; i < this->proto_file_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        15, this->proto_file(i), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}